

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paint.h
# Opt level: O2

void gimage::clipRange<float>(Image<float,_gimage::PixelTraits<float>_> *image,float from,float to)

{
  float fVar1;
  float ***pppfVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long i;
  ulong uVar9;
  
  uVar5 = 0;
  uVar4 = image->height;
  if (image->height < 1) {
    uVar4 = uVar5;
  }
  uVar3 = (ulong)(uint)image->depth;
  if (image->depth < 1) {
    uVar3 = uVar5;
  }
  for (uVar6 = 0; uVar6 != uVar3; uVar6 = uVar6 + 1) {
    uVar7 = image->width;
    if (image->width < 1) {
      uVar7 = uVar5;
    }
    for (uVar8 = 0; uVar8 != uVar4; uVar8 = uVar8 + 1) {
      pppfVar2 = image->img;
      for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
        fVar1 = pppfVar2[uVar6][uVar8][uVar9];
        if ((fVar1 < from) || (to < fVar1)) {
          pppfVar2[uVar6][uVar8][uVar9] =
               (float)(~-(uint)(to < fVar1) & (uint)from | -(uint)(to < fVar1) & (uint)to);
        }
      }
    }
  }
  return;
}

Assistant:

void clipRange(Image<T> &image, T from, T to)
{
  for (int d=0; d<image.getDepth(); d++)
  {
    for (long k=0; k<image.getHeight(); k++)
    {
      for (long i=0; i<image.getWidth(); i++)
      {
        T v=image.get(i, k, d);
        if (v < from) image.set(i, k, d, from);
        if (v > to) image.set(i, k, d, to);
      }
    }
  }
}